

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman_tests.cpp
# Opt level: O1

void __thiscall wallet::scriptpubkeyman_tests::CanProvide::test_method(CanProvide *this)

{
  Chain *chain;
  MockableData records;
  pointer pCVar1;
  int iVar2;
  LegacyScriptPubKeyMan *pLVar3;
  pointer pCVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  vector<CKey,_std::allocator<CKey>_> keys;
  SignatureData data;
  CScript p2sh_script;
  CScript multisig_script;
  CWallet wallet;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  check_type cVar8;
  undefined8 in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  size_t in_stack_fffffffffffff650;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  assertion_result local_980;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  vector<CPubKey,_std::allocator<CPubKey>_> local_948;
  vector<CKey,_std::allocator<CKey>_> local_928;
  long *local_910;
  undefined1 local_908 [24];
  char **local_8f0;
  undefined1 local_8e8 [72];
  direct_or_indirect local_8a0 [4];
  _Rb_tree_node_base local_820;
  size_t local_800;
  bool local_790;
  _Rb_tree_node_base local_780;
  size_t local_760;
  _Rb_tree_node_base local_750;
  size_t local_730;
  pointer puStack_728;
  pointer local_720;
  pointer puStack_718;
  _Rb_tree_node_base local_708;
  size_t local_6e8;
  _Rb_tree_node_base local_6d8;
  size_t local_6b8;
  _Rb_tree_node_base local_6a8;
  size_t local_688;
  pointer pCStack_680;
  pointer local_678;
  pointer pCStack_670;
  pointer local_668;
  pointer pCStack_660;
  pointer local_658;
  uchar auStack_650 [64];
  _Rb_tree_node_base local_610;
  size_t local_5f0;
  _Rb_tree_node_base local_5e0;
  size_t local_5c0;
  _Rb_tree_node_base local_5b0;
  size_t local_590;
  _Rb_tree_node_base local_580;
  size_t local_560;
  direct_or_indirect local_558;
  uint local_53c;
  direct_or_indirect local_538;
  uint local_51c;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_518;
  CWallet local_4e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_8e8._0_8_ = local_8e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"");
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl._0_8_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffff62c;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffff628;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff638;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff640;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff648;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff650;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_910,records);
  CWallet::CWallet(&local_4e0,chain,(string *)local_8e8,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_910);
  if (local_910 != (long *)0x0) {
    (**(code **)(*local_910 + 8))();
  }
  local_910 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_518);
  if ((undefined1 *)local_8e8._0_8_ != local_8e8 + 0x10) {
    operator_delete((void *)local_8e8._0_8_,CONCAT44(local_8e8._20_4_,local_8e8._16_4_) + 1);
  }
  pLVar3 = CWallet::GetOrCreateLegacyScriptPubKeyMan(&local_4e0);
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar4 = (pointer)operator_new(0x20);
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = pCVar4 + 2;
  *(undefined8 *)(pCVar4 + 1) = 0;
  pCVar4[1].keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  *(undefined8 *)pCVar4 = 0;
  (pCVar4->keydata)._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (CPubKey *)0x0;
  local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (CPubKey *)0x0;
  lVar5 = 0;
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
       = pCVar4;
  local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_928.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  do {
    CKey::MakeNewKey((CKey *)(&pCVar4->fCompressed + lVar5),true);
    CKey::GetPubKey((CPubKey *)local_8e8,(CKey *)(&pCVar4->fCompressed + lVar5));
    pCVar1 = local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                (&local_948,
                 (iterator)
                 local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish,(CPubKey *)local_8e8);
    }
    else {
      memcpy(local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish,(CPubKey *)local_8e8,0x41);
      local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar1 + 1;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x20);
  GetScriptForMultisig((CScript *)&local_538.indirect_contents,1,&local_948);
  ScriptHash::ScriptHash((ScriptHash *)local_908,(CScript *)&local_538.indirect_contents);
  local_8e8._16_4_ = local_908._16_4_;
  local_8e8._0_8_ = local_908._0_8_;
  local_8a0[0].direct[0] = '\x03';
  GetScriptForDestination((CScript *)&local_558.indirect_contents,(CTxDestination *)local_8e8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_8e8);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffff0000;
  local_820._M_color = _S_red;
  local_820._M_parent = (_Base_ptr)0x0;
  memset(local_8e8 + 8,0,0xb8);
  local_800 = 0;
  local_790 = false;
  local_780._M_left = &local_780;
  local_780._M_color = _S_red;
  local_780._M_parent = (_Base_ptr)0x0;
  local_760 = 0;
  local_750._M_left = &local_750;
  local_750._M_color = _S_red;
  local_750._M_parent = (_Base_ptr)0x0;
  local_708._M_left = &local_708;
  local_708._M_color = _S_red;
  local_708._M_parent = (_Base_ptr)0x0;
  local_730 = 0;
  puStack_728 = (pointer)0x0;
  local_720 = (pointer)0x0;
  puStack_718 = (pointer)0x0;
  local_6e8 = 0;
  local_6d8._M_left = &local_6d8;
  local_6d8._M_color = _S_red;
  local_6d8._M_parent = (_Base_ptr)0x0;
  local_6b8 = 0;
  local_6a8._M_left = &local_6a8;
  local_6a8._M_color = _S_red;
  local_6a8._M_parent = (_Base_ptr)0x0;
  local_610._M_left = &local_610;
  local_610._M_color = _S_red;
  local_610._M_parent = (_Base_ptr)0x0;
  auStack_650[0x28] = '\0';
  auStack_650[0x29] = '\0';
  auStack_650[0x2a] = '\0';
  auStack_650[0x2b] = '\0';
  auStack_650[0x2c] = '\0';
  auStack_650[0x2d] = '\0';
  auStack_650[0x2e] = '\0';
  auStack_650[0x2f] = '\0';
  auStack_650[0x30] = '\0';
  auStack_650[0x31] = '\0';
  auStack_650[0x32] = '\0';
  auStack_650[0x33] = '\0';
  auStack_650[0x18] = '\0';
  auStack_650[0x19] = '\0';
  auStack_650[0x1a] = '\0';
  auStack_650[0x1b] = '\0';
  auStack_650[0x1c] = '\0';
  auStack_650[0x1d] = '\0';
  auStack_650[0x1e] = '\0';
  auStack_650[0x1f] = '\0';
  auStack_650[0x20] = '\0';
  auStack_650[0x21] = '\0';
  auStack_650[0x22] = '\0';
  auStack_650[0x23] = '\0';
  auStack_650[0x24] = '\0';
  auStack_650[0x25] = '\0';
  auStack_650[0x26] = '\0';
  auStack_650[0x27] = '\0';
  auStack_650[8] = '\0';
  auStack_650[9] = '\0';
  auStack_650[10] = '\0';
  auStack_650[0xb] = '\0';
  auStack_650[0xc] = '\0';
  auStack_650[0xd] = '\0';
  auStack_650[0xe] = '\0';
  auStack_650[0xf] = '\0';
  auStack_650[0x10] = '\0';
  auStack_650[0x11] = '\0';
  auStack_650[0x12] = '\0';
  auStack_650[0x13] = '\0';
  auStack_650[0x14] = '\0';
  auStack_650[0x15] = '\0';
  auStack_650[0x16] = '\0';
  auStack_650[0x17] = '\0';
  local_658 = (pointer)0x0;
  auStack_650[0] = '\0';
  auStack_650[1] = '\0';
  auStack_650[2] = '\0';
  auStack_650[3] = '\0';
  auStack_650[4] = '\0';
  auStack_650[5] = '\0';
  auStack_650[6] = '\0';
  auStack_650[7] = '\0';
  local_668 = (pointer)0x0;
  pCStack_660 = (pointer)0x0;
  local_678 = (pointer)0x0;
  pCStack_670 = (pointer)0x0;
  local_688 = 0;
  pCStack_680 = (pointer)0x0;
  local_5f0 = 0;
  local_5e0._M_left = &local_5e0;
  local_5e0._M_color = _S_red;
  local_5e0._M_parent = (_Base_ptr)0x0;
  local_5c0 = 0;
  local_5b0._M_left = &local_5b0;
  local_5b0._M_color = _S_red;
  local_5b0._M_parent = (_Base_ptr)0x0;
  local_590 = 0;
  local_580._M_left = &local_580;
  local_580._M_color = _S_red;
  local_580._M_parent = (_Base_ptr)0x0;
  local_560 = 0;
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/scriptpubkeyman_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x26;
  file.m_begin = (iterator)&local_958;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_820._M_left = &local_820;
  local_820._M_right = &local_820;
  local_780._M_right = local_780._M_left;
  local_750._M_right = local_750._M_left;
  local_708._M_right = local_708._M_left;
  local_6d8._M_right = local_6d8._M_left;
  local_6a8._M_right = local_6a8._M_left;
  local_610._M_right = local_610._M_left;
  local_5e0._M_right = local_5e0._M_left;
  local_5b0._M_right = local_5b0._M_left;
  local_580._M_right = local_580._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_968,msg);
  iVar2 = (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                    (pLVar3,&local_558,local_8e8);
  local_980.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar2 ^ 1);
  local_980.m_message.px = (element_type *)0x0;
  local_980.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_990 = "!keyman.CanProvide(p2sh_script, data)";
  local_988 = "";
  local_908[8] = false;
  local_908._0_8_ = &PTR__lazy_ostream_013abc70;
  local_908._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/scriptpubkeyman_tests.cpp"
  ;
  local_998 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_8f0 = &local_990;
  boost::test_tools::tt_detail::report_assertion
            (&local_980,(lazy_ostream *)local_908,1,0,WARN,_cVar8,(size_t)&local_9a0,0x26);
  boost::detail::shared_count::~shared_count(&local_980.m_message.pn);
  (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x24])
            (pLVar3,&local_538);
  file_00.m_end = &DAT_00000028;
  file_00.m_begin = &stack0xfffffffffffff650;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffff640,msg_00);
  iVar2 = (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                    (pLVar3,&local_558,local_8e8);
  local_980.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_980.m_message.px = (element_type *)0x0;
  local_980.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_990 = "keyman.CanProvide(p2sh_script, data)";
  local_988 = "";
  local_908[8] = false;
  local_908._0_8_ = &PTR__lazy_ostream_013abc70;
  local_908._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_8f0 = &local_990;
  boost::test_tools::tt_detail::report_assertion
            (&local_980,(lazy_ostream *)local_908,1,0,WARN,0xf86241,(size_t)&stack0xfffffffffffff630
             ,0x28);
  boost::detail::shared_count::~shared_count(&local_980.m_message.pn);
  SignatureData::~SignatureData((SignatureData *)local_8e8);
  if (0x1c < local_53c) {
    free(local_558.indirect_contents.indirect);
    local_558.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < local_51c) {
    free(local_538.indirect_contents.indirect);
    local_538.indirect_contents.indirect = (char *)0x0;
  }
  if (local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_948.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_928);
  CWallet::~CWallet(&local_4e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CanProvide)
{
    // Set up wallet and keyman variables.
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    LegacyScriptPubKeyMan& keyman = *wallet.GetOrCreateLegacyScriptPubKeyMan();

    // Make a 1 of 2 multisig script
    std::vector<CKey> keys(2);
    std::vector<CPubKey> pubkeys;
    for (CKey& key : keys) {
        key.MakeNewKey(true);
        pubkeys.emplace_back(key.GetPubKey());
    }
    CScript multisig_script = GetScriptForMultisig(1, pubkeys);
    CScript p2sh_script = GetScriptForDestination(ScriptHash(multisig_script));
    SignatureData data;

    // Verify the p2sh(multisig) script is not recognized until the multisig
    // script is added to the keystore to make it solvable
    BOOST_CHECK(!keyman.CanProvide(p2sh_script, data));
    keyman.AddCScript(multisig_script);
    BOOST_CHECK(keyman.CanProvide(p2sh_script, data));
}